

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadTriangleLight(XMLLoader *this,Ref<embree::XML> *xml)

{
  _func_int **pp_Var1;
  undefined8 in_RDX;
  Node *in_RDI;
  Vec3fa VVar2;
  Vec3fa v2;
  Vec3fa v1;
  Vec3fa v0;
  Vec3fa L;
  AffineSpace3fa space;
  Vec3fa *in_stack_fffffffffffff230;
  TriangleLight *in_stack_fffffffffffff238;
  LightNodeImpl<embree::SceneGraph::TriangleLight> *this_00;
  Vec3fa *v0_00;
  TriangleLight *this_01;
  Ref<embree::XML> *in_stack_fffffffffffff2a8;
  XMLLoader *in_stack_fffffffffffff2b0;
  string *in_stack_fffffffffffff2e8;
  XML *in_stack_fffffffffffff2f0;
  undefined8 local_d08;
  undefined8 uStack_d00;
  undefined1 local_cf8 [87];
  allocator local_ca1;
  string local_ca0 [32];
  long *local_c80 [5];
  allocator local_c51;
  string local_c50 [32];
  long *local_c30;
  undefined1 local_c28 [16];
  undefined1 local_c18 [16];
  undefined1 local_c08 [16];
  undefined1 local_bf8 [16];
  undefined8 local_be8;
  undefined8 local_bd0;
  undefined4 local_bbc;
  undefined4 local_bb8;
  undefined4 local_bb4;
  undefined1 *local_bb0;
  undefined4 local_ba4;
  undefined4 local_ba0;
  undefined4 local_b9c;
  undefined1 *local_b98;
  undefined4 local_b8c;
  undefined4 local_b88;
  undefined4 local_b84;
  undefined8 *local_b80;
  long **local_b78;
  long **local_b68;
  _func_int **local_b58;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 *local_af0;
  undefined1 *local_ae8;
  TriangleLight *local_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined1 *local_a80;
  undefined1 *local_a78;
  Vec3fa *local_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined1 *local_a10;
  undefined1 *local_a08;
  LightNodeImpl<embree::SceneGraph::TriangleLight> *local_a00;
  undefined4 local_9f4;
  undefined8 *local_9f0;
  undefined4 local_9e4;
  undefined8 *local_9e0;
  undefined4 local_9d4;
  undefined8 *local_9d0;
  undefined4 local_9c4;
  undefined8 *local_9c0;
  undefined4 local_9b4;
  undefined8 *local_9b0;
  undefined4 local_9a4;
  undefined8 *local_9a0;
  undefined4 local_994;
  undefined8 *local_990;
  undefined4 local_984;
  undefined8 *local_980;
  undefined4 local_974;
  undefined8 *local_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined4 local_958;
  undefined4 local_954;
  undefined4 local_950;
  undefined4 local_94c;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined4 local_938;
  undefined4 local_934;
  undefined4 local_930;
  undefined4 local_92c;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined4 local_918;
  undefined4 local_914;
  undefined4 local_910;
  undefined4 local_90c;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined8 *local_8f0;
  undefined1 *local_8e8;
  undefined8 *local_8e0;
  LightNodeImpl<embree::SceneGraph::TriangleLight> *local_8d8;
  undefined8 *local_8d0;
  undefined8 *local_8c8;
  LightNodeImpl<embree::SceneGraph::TriangleLight> *local_8c0;
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  LightNodeImpl<embree::SceneGraph::TriangleLight> *local_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 *local_880;
  undefined1 *local_878;
  undefined8 *local_870;
  undefined8 *local_868;
  undefined8 *local_860;
  undefined8 *local_858;
  undefined8 *local_850;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  undefined8 *local_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined1 *local_810;
  undefined1 *local_808;
  undefined8 *local_800;
  undefined8 *local_7f8;
  undefined1 *local_7f0;
  undefined8 *local_7e8;
  undefined8 *local_7e0;
  float local_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  undefined8 *local_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 *local_7a0;
  undefined1 *local_798;
  undefined8 *local_790;
  Vec3fa *local_788;
  undefined8 *local_780;
  undefined8 *local_778;
  Vec3fa *local_770;
  float local_768;
  float fStack_764;
  float fStack_760;
  float fStack_75c;
  Vec3fa *local_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 *local_730;
  undefined1 *local_728;
  undefined8 *local_720;
  undefined8 *local_718;
  undefined8 *local_710;
  undefined8 *local_708;
  undefined8 *local_700;
  float local_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  undefined8 *local_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined1 *local_6c0;
  undefined1 *local_6b8;
  undefined8 *local_6b0;
  undefined8 *local_6a8;
  undefined1 *local_6a0;
  undefined8 *local_698;
  undefined8 *local_690;
  float local_688;
  float fStack_684;
  float fStack_680;
  float fStack_67c;
  undefined8 *local_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 *local_650;
  undefined1 *local_648;
  undefined8 *local_640;
  TriangleLight *local_638;
  undefined8 *local_630;
  undefined8 *local_628;
  TriangleLight *local_620;
  float local_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  TriangleLight *local_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 *local_5e0;
  undefined1 *local_5d8;
  undefined8 *local_5d0;
  undefined8 *local_5c8;
  undefined8 *local_5c0;
  undefined8 *local_5b8;
  undefined8 *local_5b0;
  float local_5a8;
  float fStack_5a4;
  float fStack_5a0;
  float fStack_59c;
  undefined8 *local_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined1 *local_570;
  undefined1 *local_568;
  undefined8 *local_560;
  undefined8 *local_558;
  undefined1 *local_550;
  undefined8 *local_548;
  undefined8 *local_540;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  undefined8 *local_528;
  undefined1 *local_520;
  undefined8 *local_518;
  undefined8 *local_510;
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  undefined8 *local_4f8;
  undefined1 *local_4f0;
  undefined8 *local_4e8;
  undefined8 *local_4e0;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  undefined8 *local_4c8;
  undefined1 *local_4c0;
  undefined8 *local_4b8;
  undefined8 *local_4b0;
  float local_4a8;
  float fStack_4a4;
  float fStack_4a0;
  float fStack_49c;
  undefined8 *local_498;
  undefined1 *local_490;
  undefined8 *local_488;
  undefined8 *local_480;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  undefined8 *local_468;
  undefined1 *local_460;
  undefined8 *local_458;
  undefined8 *local_450;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  undefined8 *local_438;
  undefined1 *local_430;
  undefined8 *local_428;
  undefined8 *local_420;
  float local_418;
  float fStack_414;
  undefined4 in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf4;
  XMLLoader *in_stack_fffffffffffffbf8;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  local_be8 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c50,"AffineSpace",&local_c51);
  XML::child(in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8);
  load<embree::AffineSpaceT<embree::LinearSpace3<embree::Vec3fa>>>
            (in_stack_fffffffffffffbf8,
             (Ref<embree::XML> *)CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0));
  local_b78 = &local_c30;
  if (local_c30 != (long *)0x0) {
    (**(code **)(*local_c30 + 0x18))();
  }
  std::__cxx11::string::~string(local_c50);
  std::allocator<char>::~allocator((allocator<char> *)&local_c51);
  local_bd0 = local_be8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_ca0,"L",&local_ca1);
  XML::child(in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8);
  VVar2 = load<embree::Vec3fa>(in_stack_fffffffffffff2b0,in_stack_fffffffffffff2a8);
  local_b68 = local_c80;
  if (local_c80[0] != (long *)0x0) {
    (**(code **)(*local_c80[0] + 0x18))(VVar2.field_0._0_4_,VVar2.field_0._8_4_);
  }
  std::__cxx11::string::~string(local_ca0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ca1);
  local_bb0 = local_cf8 + 0x30;
  local_bb4 = 0x3f800000;
  local_bb8 = 0;
  local_bbc = 0;
  local_90c = 0;
  local_910 = 0;
  local_914 = 0;
  local_918 = 0x3f800000;
  local_928 = 0x3f800000;
  uStack_920 = 0;
  local_cf8._48_8_ = 0x3f800000;
  local_cf8._56_8_ = 0;
  this_00 = (LightNodeImpl<embree::SceneGraph::TriangleLight> *)(local_cf8 + 0x40);
  local_ae8 = local_c28;
  local_9d4 = 0x3f800000;
  local_9d0 = &local_a28;
  local_a28 = 0x3f8000003f800000;
  uStack_a20 = 0x3f8000003f800000;
  local_9e4 = 0;
  local_9e0 = &local_a48;
  local_a48 = 0;
  uStack_a40 = 0;
  local_878 = local_c18;
  local_9f4 = 0;
  local_9f0 = &local_a68;
  local_a68 = 0;
  uStack_a60 = 0;
  local_808 = local_c08;
  local_810 = local_bf8;
  local_880 = &local_a58;
  local_7e8 = &local_828;
  local_328 = (float)local_c08._0_8_;
  fStack_324 = SUB84(local_c08._0_8_,4);
  fStack_320 = (float)local_c08._8_8_;
  fStack_31c = SUB84(local_c08._8_8_,4);
  local_828 = CONCAT44(fStack_324 * 0.0,local_328 * 0.0);
  uStack_820 = CONCAT44(fStack_31c * 0.0,fStack_320 * 0.0);
  local_68 = (float)local_bf8._0_8_;
  fStack_64 = SUB84(local_bf8._0_8_,4);
  fStack_60 = (float)local_bf8._8_8_;
  fStack_5c = SUB84(local_bf8._8_8_,4);
  local_7d8 = local_328 * 0.0 + local_68;
  fStack_7d4 = fStack_324 * 0.0 + fStack_64;
  fStack_7d0 = fStack_320 * 0.0 + fStack_60;
  fStack_7cc = fStack_31c * 0.0 + fStack_5c;
  local_8f0 = &local_a38;
  local_858 = &local_898;
  local_348 = (float)local_c18._0_8_;
  fStack_344 = SUB84(local_c18._0_8_,4);
  fStack_340 = (float)local_c18._8_8_;
  fStack_33c = SUB84(local_c18._8_8_,4);
  local_898 = CONCAT44(fStack_344 * 0.0,local_348 * 0.0);
  uStack_890 = CONCAT44(fStack_33c * 0.0,fStack_340 * 0.0);
  local_48 = (float)local_a58;
  fStack_44 = (float)((ulong)local_a58 >> 0x20);
  fStack_40 = (float)uStack_a50;
  fStack_3c = (float)((ulong)uStack_a50 >> 0x20);
  local_848 = local_348 * 0.0 + local_48;
  fStack_844 = fStack_344 * 0.0 + fStack_44;
  fStack_840 = fStack_340 * 0.0 + fStack_40;
  fStack_83c = fStack_33c * 0.0 + fStack_3c;
  local_8c8 = &local_908;
  local_368 = (float)local_c28._0_8_;
  fStack_364 = SUB84(local_c28._0_8_,4);
  fStack_360 = (float)local_c28._8_8_;
  fStack_35c = SUB84(local_c28._8_8_,4);
  local_908 = CONCAT44(fStack_364 * 1.0,local_368 * 1.0);
  uStack_900 = CONCAT44(fStack_35c * 1.0,fStack_360 * 1.0);
  local_28 = (float)local_a38;
  fStack_24 = (float)((ulong)local_a38 >> 0x20);
  fStack_20 = (float)uStack_a30;
  fStack_1c = (float)((ulong)uStack_a30 >> 0x20);
  local_8b8 = local_368 * 1.0 + local_28;
  fStack_8b4 = fStack_364 * 1.0 + fStack_24;
  fStack_8b0 = fStack_360 * 1.0 + fStack_20;
  fStack_8ac = fStack_35c * 1.0 + fStack_1c;
  local_cf8._64_8_ = CONCAT44(fStack_8b4,local_8b8);
  local_cf8._72_8_ = CONCAT44(fStack_8ac,fStack_8b0);
  local_b98 = local_cf8 + 0x10;
  local_b9c = 0;
  local_ba0 = 0x3f800000;
  local_ba4 = 0;
  local_92c = 0;
  local_930 = 0;
  local_934 = 0x3f800000;
  local_938 = 0;
  local_948 = 0x3f80000000000000;
  uStack_940 = 0;
  local_cf8._16_8_ = 0x3f80000000000000;
  local_cf8._24_8_ = 0;
  v0_00 = (Vec3fa *)(local_cf8 + 0x20);
  local_9a4 = 0;
  local_9a0 = &local_a98;
  local_a98 = 0;
  uStack_a90 = 0;
  local_9b4 = 0x3f800000;
  local_9b0 = &local_ab8;
  local_ab8 = 0x3f8000003f800000;
  uStack_ab0 = 0x3f8000003f800000;
  local_728 = local_c18;
  local_9c4 = 0;
  local_9c0 = &local_ad8;
  local_ad8 = 0;
  uStack_ad0 = 0;
  local_6b8 = local_c08;
  local_6c0 = local_bf8;
  local_730 = &local_ac8;
  local_698 = &local_6d8;
  local_478 = local_328 * 0.0;
  fStack_474 = fStack_324 * 0.0;
  fStack_470 = fStack_320 * 0.0;
  fStack_46c = fStack_31c * 0.0;
  local_6d8 = CONCAT44(fStack_474,local_478);
  uStack_6d0 = CONCAT44(fStack_46c,fStack_470);
  local_688 = local_478 + local_68;
  fStack_684 = fStack_474 + fStack_64;
  fStack_680 = fStack_470 + fStack_60;
  fStack_67c = fStack_46c + fStack_5c;
  local_7a0 = &local_aa8;
  local_708 = &local_748;
  local_448 = local_348 * 1.0;
  fStack_444 = fStack_344 * 1.0;
  fStack_440 = fStack_340 * 1.0;
  fStack_43c = fStack_33c * 1.0;
  local_748 = CONCAT44(fStack_444,local_448);
  uStack_740 = CONCAT44(fStack_43c,fStack_440);
  local_a8 = (float)local_ac8;
  fStack_a4 = (float)((ulong)local_ac8 >> 0x20);
  fStack_a0 = (float)uStack_ac0;
  fStack_9c = (float)((ulong)uStack_ac0 >> 0x20);
  local_6f8 = local_448 + local_a8;
  fStack_6f4 = fStack_444 + fStack_a4;
  fStack_6f0 = fStack_440 + fStack_a0;
  fStack_6ec = fStack_43c + fStack_9c;
  local_778 = &local_7b8;
  local_418 = local_368 * 0.0;
  fStack_414 = fStack_364 * 0.0;
  local_7b8 = CONCAT44(fStack_414,local_418);
  uStack_7b0 = CONCAT44(fStack_35c * 0.0,fStack_360 * 0.0);
  local_88 = (float)local_aa8;
  fStack_84 = (float)((ulong)local_aa8 >> 0x20);
  fStack_80 = (float)uStack_aa0;
  fStack_7c = (float)((ulong)uStack_aa0 >> 0x20);
  local_768 = local_418 + local_88;
  fStack_764 = fStack_414 + fStack_84;
  fStack_760 = fStack_360 * 0.0 + fStack_80;
  fStack_75c = fStack_35c * 0.0 + fStack_7c;
  local_cf8._32_8_ = CONCAT44(fStack_764,local_768);
  local_cf8._40_8_ = CONCAT44(fStack_75c,fStack_760);
  local_b80 = &local_d08;
  local_b84 = 0;
  local_b88 = 0;
  local_b8c = 0;
  local_94c = 0;
  local_950 = 0;
  local_954 = 0;
  local_958 = 0;
  local_968 = 0;
  uStack_960 = 0;
  local_d08 = 0;
  uStack_d00 = 0;
  this_01 = (TriangleLight *)local_cf8;
  local_974 = 0;
  local_970 = &local_b08;
  local_b08 = 0;
  uStack_b00 = 0;
  local_984 = 0;
  local_980 = &local_b28;
  local_b28 = 0;
  uStack_b20 = 0;
  local_5d8 = local_c18;
  local_994 = 0;
  local_990 = &local_b48;
  local_b48 = 0;
  uStack_b40 = 0;
  local_568 = local_c08;
  local_570 = local_bf8;
  local_5e0 = &local_b38;
  local_548 = &local_588;
  local_508 = local_328 * 0.0;
  fStack_504 = fStack_324 * 0.0;
  fStack_500 = fStack_320 * 0.0;
  fStack_4fc = fStack_31c * 0.0;
  local_588 = CONCAT44(fStack_504,local_508);
  uStack_580 = CONCAT44(fStack_4fc,fStack_500);
  local_538 = local_508 + local_68;
  fStack_534 = fStack_504 + fStack_64;
  fStack_530 = fStack_500 + fStack_60;
  fStack_52c = fStack_4fc + fStack_5c;
  local_650 = &local_b18;
  local_5b8 = &local_5f8;
  local_4d8 = local_348 * 0.0;
  fStack_4d4 = fStack_344 * 0.0;
  fStack_4d0 = fStack_340 * 0.0;
  fStack_4cc = fStack_33c * 0.0;
  local_5f8 = CONCAT44(fStack_4d4,local_4d8);
  uStack_5f0 = CONCAT44(fStack_4cc,fStack_4d0);
  local_108 = (float)local_b38;
  fStack_104 = (float)((ulong)local_b38 >> 0x20);
  fStack_100 = (float)uStack_b30;
  fStack_fc = (float)((ulong)uStack_b30 >> 0x20);
  local_5a8 = local_4d8 + local_108;
  fStack_5a4 = fStack_4d4 + fStack_104;
  fStack_5a0 = fStack_4d0 + fStack_100;
  fStack_59c = fStack_4cc + fStack_fc;
  local_628 = &local_668;
  local_4a8 = local_368 * 0.0;
  fStack_4a4 = fStack_364 * 0.0;
  fStack_4a0 = fStack_360 * 0.0;
  fStack_49c = fStack_35c * 0.0;
  local_668 = CONCAT44(fStack_4a4,local_4a8);
  uStack_660 = CONCAT44(fStack_49c,fStack_4a0);
  local_e8 = (float)local_b18;
  fStack_e4 = (float)((ulong)local_b18 >> 0x20);
  fStack_e0 = (float)uStack_b10;
  fStack_dc = (float)((ulong)uStack_b10 >> 0x20);
  local_618 = local_4a8 + local_e8;
  fStack_614 = fStack_4a4 + fStack_e4;
  fStack_610 = fStack_4a0 + fStack_e0;
  fStack_60c = fStack_49c + fStack_dc;
  local_cf8._4_4_ = fStack_614;
  local_cf8._0_4_ = (LightType)local_618;
  local_cf8._12_4_ = fStack_60c;
  local_cf8._8_4_ = fStack_610;
  local_af0 = local_b80;
  local_ae0 = this_01;
  local_a80 = local_b98;
  local_a78 = local_ae8;
  local_a70 = v0_00;
  local_a10 = local_bb0;
  local_a08 = local_ae8;
  local_a00 = this_00;
  local_8e8 = local_ae8;
  local_8e0 = local_9d0;
  local_8d8 = this_00;
  local_8d0 = local_8f0;
  local_8c0 = this_00;
  local_8a0 = this_00;
  local_870 = local_9e0;
  local_868 = local_8f0;
  local_860 = local_880;
  local_850 = local_8f0;
  local_830 = local_8f0;
  local_800 = local_9f0;
  local_7f8 = local_880;
  local_7f0 = local_810;
  local_7e0 = local_880;
  local_7c0 = local_880;
  local_798 = local_ae8;
  local_790 = local_9a0;
  local_788 = v0_00;
  local_780 = local_7a0;
  local_770 = v0_00;
  local_750 = v0_00;
  local_720 = local_9b0;
  local_718 = local_7a0;
  local_710 = local_730;
  local_700 = local_7a0;
  local_6e0 = local_7a0;
  local_6b0 = local_9c0;
  local_6a8 = local_730;
  local_6a0 = local_6c0;
  local_690 = local_730;
  local_670 = local_730;
  local_648 = local_ae8;
  local_640 = local_970;
  local_638 = this_01;
  local_630 = local_650;
  local_620 = this_01;
  local_600 = this_01;
  local_5d0 = local_980;
  local_5c8 = local_650;
  local_5c0 = local_5e0;
  local_5b0 = local_650;
  local_590 = local_650;
  local_560 = local_990;
  local_558 = local_5e0;
  local_550 = local_570;
  local_540 = local_5e0;
  local_528 = local_5e0;
  local_520 = local_568;
  local_518 = local_990;
  local_510 = local_548;
  local_4f8 = local_548;
  local_4f0 = local_5d8;
  local_4e8 = local_980;
  local_4e0 = local_5b8;
  local_4c8 = local_5b8;
  local_4c0 = local_ae8;
  local_4b8 = local_970;
  local_4b0 = local_628;
  local_498 = local_628;
  local_490 = local_6b8;
  local_488 = local_9c0;
  local_480 = local_698;
  local_468 = local_698;
  local_460 = local_728;
  local_458 = local_9b0;
  local_450 = local_708;
  local_438 = local_708;
  local_430 = local_ae8;
  local_428 = local_9a0;
  local_420 = local_778;
  local_b38 = CONCAT44(fStack_534,local_538);
  uStack_b30 = CONCAT44(fStack_52c,fStack_530);
  local_b18 = CONCAT44(fStack_5a4,local_5a8);
  uStack_b10 = CONCAT44(fStack_59c,fStack_5a0);
  local_ac8 = CONCAT44(fStack_684,local_688);
  uStack_ac0 = CONCAT44(fStack_67c,fStack_680);
  local_aa8 = CONCAT44(fStack_6f4,local_6f8);
  uStack_aa0 = CONCAT44(fStack_6ec,fStack_6f0);
  local_a58 = CONCAT44(fStack_7d4,local_7d8);
  uStack_a50 = CONCAT44(fStack_7cc,fStack_7d0);
  local_a38 = CONCAT44(fStack_844,local_848);
  uStack_a30 = CONCAT44(fStack_83c,fStack_840);
  pp_Var1 = (_func_int **)
            SceneGraph::LightNodeImpl<embree::SceneGraph::TriangleLight>::operator_new(0x3828b3);
  SceneGraph::TriangleLight::TriangleLight
            (this_01,v0_00,(Vec3fa *)this_00,(Vec3fa *)in_stack_fffffffffffff238,
             in_stack_fffffffffffff230);
  SceneGraph::LightNodeImpl<embree::SceneGraph::TriangleLight>::LightNodeImpl
            (this_00,in_stack_fffffffffffff238);
  (in_RDI->super_RefCount)._vptr_RefCount = pp_Var1;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    local_b58 = pp_Var1;
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadTriangleLight(const Ref<XML>& xml) 
  {
    const AffineSpace3fa space = load<AffineSpace3fa>(xml->child("AffineSpace"));
    const Vec3fa L = load<Vec3fa>(xml->child("L"));
    const Vec3fa v0 = xfmPoint(space, Vec3fa(1, 0, 0));
    const Vec3fa v1 = xfmPoint(space, Vec3fa(0, 1, 0));
    const Vec3fa v2 = xfmPoint(space, Vec3fa(0, 0, 0));
    return new SceneGraph::LightNodeImpl<SceneGraph::TriangleLight>(SceneGraph::TriangleLight(v0,v1,v2,L));
  }